

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

void test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
               (SquareMatrix<double> *m1,SquareMatrix<double> *m2,double eps)

{
  ulong uVar1;
  double unaff_RBX;
  ulong uVar2;
  pointer *__ptr;
  ulong uVar3;
  char *message;
  double unaff_R12;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa8;
  AssertionResult gtest_ar;
  AssertHelper in_stack_ffffffffffffffc8;
  
  uVar1 = m1->size_;
  if (uVar1 == m2->size_) {
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                   (char *)in_stack_ffffffffffffffa8._M_head_impl,
                   (char *)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,unaff_R12,unaff_RBX,(double)in_stack_ffffffffffffffc8.data_
                  );
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&stack0xffffffffffffffa8);
          message = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                     ,0xe,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffa8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )in_stack_ffffffffffffffa8._M_head_impl !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)in_stack_ffffffffffffffa8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        uVar1 = m1->size_;
      }
    }
    return;
  }
  __assert_fail("m1.size() == m2.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                ,0xb,
                "void test_qpixl_frqi_check_matrix(const MAT1 &, const MAT2 &, const R) [MAT1 = qclab::dense::SquareMatrix<double>, MAT2 = qclab::dense::SquareMatrix<double>, R = double]"
               );
}

Assistant:

void test_qpixl_frqi_check_matrix( const MAT1& m1, const MAT2& m2, const R eps ) {
  assert( m1.size() == m2.size() ) ;
  for ( size_t i = 0; i < m1.size(); i++ ) {
    for ( size_t j = 0; j < m1.size(); j++ ) {
      EXPECT_NEAR( m1(i,j) , m2(i,j)  , eps );
    }
  }
}